

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void basist::decoder_etc_block::get_block_color5
               (color32 *base_color5,uint32_t inten_table,uint32_t index,uint32_t *r,uint32_t *g,
               uint32_t *b)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  uint32_t uVar5;
  
  if (index < 4) {
    bVar1 = (base_color5->field_0).field_0.r;
    bVar2 = (base_color5->field_0).field_0.g;
    bVar3 = (base_color5->field_0).field_0.b;
    iVar4 = (&g_etc1_inten_tables)[(ulong)inten_table * 4 + (ulong)index];
    uVar5 = ((uint)(bVar1 >> 2) | (uint)bVar1 * 8) + iVar4;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
    *r = uVar5;
    uVar5 = ((uint)(bVar2 >> 2) | (uint)bVar2 * 8) + iVar4;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
    *g = uVar5;
    uVar5 = ((uint)(bVar3 >> 2) | (uint)bVar3 * 8) + iVar4;
    if ((int)uVar5 < 1) {
      uVar5 = 0;
    }
    if (0xfe < (int)uVar5) {
      uVar5 = 0xff;
    }
    *b = uVar5;
    return;
  }
  __assert_fail("index < 4",
                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                ,0x33d,
                "static void basist::decoder_etc_block::get_block_color5(const color32 &, uint32_t, uint32_t, uint32_t &, uint32_t &, uint32_t &)"
               );
}

Assistant:

static void get_block_color5(const color32& base_color5, uint32_t inten_table, uint32_t index, uint32_t& r, uint32_t &g, uint32_t &b)
		{
			assert(index < 4);

			uint32_t br = (base_color5.r << 3) | (base_color5.r >> 2);
			uint32_t bg = (base_color5.g << 3) | (base_color5.g >> 2);
			uint32_t bb = (base_color5.b << 3) | (base_color5.b >> 2);

			const int* pInten_table = g_etc1_inten_tables[inten_table];

			r = clamp255(br + pInten_table[index]);
			g = clamp255(bg + pInten_table[index]);
			b = clamp255(bb + pInten_table[index]);
		}